

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_vector.hpp
# Opt level: O0

vector<signed_char,_std::allocator<signed_char>_> *
utility::random_vector<signed_char>
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,size_t size,
          char min,char max)

{
  anon_class_16_2_a39a3d48 __gen;
  iterator __first;
  size_type __n;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  default_random_engine generator;
  uniform_int_distribution<signed_char> uniform;
  allocator<signed_char> local_1c;
  undefined1 local_1b;
  char local_1a;
  char local_19;
  char max_local;
  size_t sStack_18;
  char min_local;
  size_t size_local;
  vector<signed_char,_std::allocator<signed_char>_> *numbers;
  
  local_1b = 0;
  local_1a = max;
  local_19 = min;
  sStack_18 = size;
  size_local = (size_t)__return_storage_ptr__;
  std::allocator<signed_char>::allocator(&local_1c);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (__return_storage_ptr__,size,&local_1c);
  std::allocator<signed_char>::~allocator(&local_1c);
  std::uniform_int_distribution<signed_char>::uniform_int_distribution
            ((uniform_int_distribution<signed_char> *)((long)&generator._M_x + 2),local_19,local_1a)
  ;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_38);
  __first = std::vector<signed_char,_std::allocator<signed_char>_>::begin(__return_storage_ptr__);
  __n = std::vector<signed_char,_std::allocator<signed_char>_>::size(__return_storage_ptr__);
  __gen.generator = &local_38;
  __gen.uniform = (uniform_int_distribution<signed_char> *)((long)&generator._M_x + 2);
  std::
  generate_n<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,unsigned_long,utility::random_vector<signed_char>(unsigned_long,signed_char,signed_char)::_lambda()_1_>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,__n,__gen);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> random_vector (std::size_t size, Integer min, Integer max)
    {
        std::vector<Integer> numbers(size);

        std::uniform_int_distribution<Integer> uniform(min, max);
        std::default_random_engine generator;

        std::generate_n(numbers.begin(), numbers.size(),
            [& uniform, & generator]
            {
                return uniform(generator);
            });

        return numbers;
    }